

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall EOPlus::Context::Context(Context *this,Quest *quest)

{
  this->_vptr_Context = (_func_int **)&PTR___cxa_pure_virtual_001bc580;
  this->quest = quest;
  this->state = (State *)0x0;
  (this->state_name)._M_dataplus._M_p = (pointer)&(this->state_name).field_2;
  (this->state_name)._M_string_length = 0;
  (this->state_name).field_2._M_local_buf[0] = '\0';
  this->finished = false;
  return;
}

Assistant:

Context::Context(const Quest* quest)
		: quest(quest)
		, state(0)
		, finished(false)
	{ }